

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O0

r_memory_map * __thiscall
pager::map_page_from(r_memory_map *__return_storage_ptr__,pager *this,uint64_t ofs)

{
  size_t offset;
  int fd;
  FILE *__stream;
  size_t len;
  r_memory_map local_50;
  uint64_t local_30;
  size_t blockOfs;
  uint64_t blockStart;
  uint64_t ofs_local;
  pager *this_local;
  
  blockStart = ofs;
  ofs_local = (uint64_t)this;
  this_local = (pager *)__return_storage_ptr__;
  blockOfs = block_start_from(this,ofs);
  local_30 = blockStart - blockOfs;
  __stream = (FILE *)r_file::operator_cast_to__IO_FILE_(&this->_f);
  fd = fileno(__stream);
  offset = blockOfs;
  len = block_size();
  r_memory_map::r_memory_map(&local_50,fd,offset,len,3,5,local_30);
  r_memory_map::r_memory_map(__return_storage_ptr__,&local_50);
  r_memory_map::~r_memory_map(&local_50);
  return __return_storage_ptr__;
}

Assistant:

r_memory_map pager::map_page_from(uint64_t ofs) const
{
    auto blockStart = block_start_from(ofs);
    size_t blockOfs = ofs - blockStart;

    return std::move(r_memory_map(fileno(_f),
                                blockStart,
                                pager::block_size(),
                                r_memory_map::MM_PROT_READ | r_memory_map::MM_PROT_WRITE,
                                r_memory_map::MM_TYPE_FILE | r_memory_map::MM_SHARED,
                                blockOfs));
}